

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O0

disp_binding_activator_t * __thiscall
so_5::disp::reuse::
binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_one_thread::strictly_ordered::private_dispatcher_t>,_so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_one_thread::strictly_ordered::private_dispatcher_t>,_so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
            *this,environment_t *param_1,agent_ref_t *agent)

{
  proxy_dispatcher_t *disp;
  intrusive_ptr_t<so_5::agent_t> local_30;
  agent_ref_t *local_28;
  agent_ref_t *agent_local;
  environment_t *param_1_local;
  binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_one_thread::strictly_ordered::private_dispatcher_t>,_so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
  *this_local;
  
  disp = this->m_instance;
  local_28 = agent;
  agent_local = (agent_ref_t *)param_1;
  param_1_local = (environment_t *)this;
  this_local = (binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_one_thread::strictly_ordered::private_dispatcher_t>,_so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
                *)__return_storage_ptr__;
  intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t(&local_30,agent);
  prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t::do_bind
            (__return_storage_ptr__,(binding_actions_mixin_t *)this,(actual_disp_iface_t *)disp,
             &local_30);
  intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & /* env */,
			agent_ref_t agent ) override
			{
				return this->do_bind( m_instance, std::move( agent ) );
			}